

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_public.c
# Opt level: O2

nng_err nng_http_server_error(nng_http_server *srv,nng_http *conn)

{
  nng_err nVar1;
  
  nVar1 = nni_http_server_error(srv,conn);
  return nVar1;
}

Assistant:

nng_err
nng_http_server_error(nng_http_server *srv, nng_http *conn)
{
#ifdef NNG_SUPP_HTTP
	return (nni_http_server_error(srv, conn));
#else
	NNI_ARG_UNUSED(srv);
	NNI_ARG_UNUSED(res);
	return (NNG_ENOTSUP);
#endif
}